

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluator.cxx
# Opt level: O1

string * __thiscall
GeneratorExpressionContent::EvaluateParameters
          (string *__return_storage_ptr__,GeneratorExpressionContent *this,
          cmGeneratorExpressionNode *node,string *identifier,cmGeneratorExpressionContext *context,
          cmGeneratorExpressionDAGChecker *dagChecker,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pvVar2;
  pointer ppcVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  ostream *poVar7;
  size_type *psVar8;
  pointer ppcVar9;
  uint uVar10;
  const_iterator pit;
  bool bVar11;
  string parameter;
  string local_228;
  cmGeneratorExpressionContext *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string *local_1e0;
  GeneratorExpressionContent *local_1d8;
  string *local_1d0;
  uint local_1c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  cmGeneratorExpressionNode *local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_208 = context;
  local_1e0 = __return_storage_ptr__;
  local_1d0 = identifier;
  uVar4 = (*node->_vptr_cmGeneratorExpressionNode[5])(node);
  pit._M_current =
       (this->ParamChildren).
       super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->ParamChildren).
           super__Vector_base<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>,_std::allocator<std::vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = this;
  local_1b8 = node;
  iVar5 = (*node->_vptr_cmGeneratorExpressionNode[4])(node);
  local_1b0 = pvVar2;
  if (pit._M_current != pvVar2) {
    local_1c0 = &local_1e0->field_2;
    uVar10 = 1;
    local_1c4 = uVar4;
    do {
      if ((uVar10 == local_1c4 & (byte)iVar5) == 1) {
        ProcessArbitraryContent
                  ((string *)local_1a8,local_1d8,local_1b8,local_1d0,local_208,dagChecker,pit);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(parameters,(string *)local_1a8);
        (local_1e0->_M_dataplus)._M_p = (pointer)local_1c0;
        local_1e0->_M_string_length = 0;
        (local_1e0->field_2)._M_local_buf[0] = '\0';
        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
          return local_1e0;
        }
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        return local_1e0;
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      ppcVar3 = ((pit._M_current)->
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar9 = ((pit._M_current)->
                     super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; bVar11 = ppcVar9 != ppcVar3, bVar11
          ; ppcVar9 = ppcVar9 + 1) {
        (*(*ppcVar9)->_vptr_cmGeneratorExpressionEvaluator[3])
                  (&local_228,*ppcVar9,local_208,dagChecker);
        std::__cxx11::string::_M_append(local_1a8,(ulong)local_228._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if (local_208->HadError == true) {
          (local_1e0->_M_dataplus)._M_p = (pointer)local_1c0;
          local_1e0->_M_string_length = 0;
          (local_1e0->field_2)._M_local_buf[0] = '\0';
          goto LAB_003ebbed;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(parameters,(value_type *)local_1a8);
LAB_003ebbed:
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      if (bVar11) {
        return local_1e0;
      }
      pit._M_current = pit._M_current + 1;
      uVar10 = uVar10 + 1;
      uVar4 = local_1c4;
    } while (pit._M_current != local_1b0);
  }
  if (((int)uVar4 < 1) ||
     ((long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)uVar4)) {
    if (uVar4 != 0xfffffffe) {
      if ((uVar4 == 0xffffffff) &&
         ((parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (parameters->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish)) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,local_1d8->StartContent,
                   local_1d8->StartContent + local_1d8->ContentLength);
        std::operator+(&local_200,"$<",local_1d0);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_228.field_2._M_allocated_capacity = *psVar8;
          local_228.field_2._8_8_ = plVar6[3];
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        }
        else {
          local_228.field_2._M_allocated_capacity = *psVar8;
          local_228._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_228._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        reportError(local_208,(string *)local_1a8,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
      goto LAB_003ec182;
    }
    if ((ulong)((long)(parameters->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(parameters->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_003ec182;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,local_1d8->StartContent,
               local_1d8->StartContent + local_1d8->ContentLength);
    std::operator+(&local_200,"$<",local_1d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_228.field_2._M_allocated_capacity = *psVar8;
      local_228.field_2._8_8_ = plVar6[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar8;
      local_228._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_228._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    reportError(local_208,(string *)local_1a8,&local_228);
  }
  else {
    if (uVar4 != 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::operator+(&local_200,"$<",local_1d0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
      paVar1 = &local_228.field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_228.field_2._M_allocated_capacity = *psVar8;
        local_228.field_2._8_8_ = plVar6[3];
        local_228._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_228.field_2._M_allocated_capacity = *psVar8;
        local_228._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_228._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length
                         );
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7," comma separated parameters, but got ",0x25);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," instead.",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      local_228._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_228,local_1d8->StartContent,
                 local_1d8->StartContent + local_1d8->ContentLength);
      std::__cxx11::stringbuf::str();
      reportError(local_208,&local_228,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar1) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      goto LAB_003ec182;
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,local_1d8->StartContent,
               local_1d8->StartContent + local_1d8->ContentLength);
    std::operator+(&local_200,"$<",local_1d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_228.field_2._M_allocated_capacity = *psVar8;
      local_228.field_2._8_8_ = plVar6[3];
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar8;
      local_228._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_228._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    reportError(local_208,(string *)local_1a8,&local_228);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
  }
LAB_003ec182:
  (local_1e0->_M_dataplus)._M_p = (pointer)&local_1e0->field_2;
  local_1e0->_M_string_length = 0;
  (local_1e0->field_2)._M_local_buf[0] = '\0';
  return local_1e0;
}

Assistant:

std::string GeneratorExpressionContent::EvaluateParameters(
  const cmGeneratorExpressionNode* node, const std::string& identifier,
  cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::vector<std::string>& parameters) const
{
  const int numExpected = node->NumExpectedParameters();
  {
    std::vector<std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator
      pit = this->ParamChildren.begin();
    const std::vector<
      std::vector<cmGeneratorExpressionEvaluator*> >::const_iterator pend =
      this->ParamChildren.end();
    const bool acceptsArbitraryContent =
      node->AcceptsArbitraryContentParameter();
    int counter = 1;
    for (; pit != pend; ++pit, ++counter) {
      if (acceptsArbitraryContent && counter == numExpected) {
        std::string lastParam = this->ProcessArbitraryContent(
          node, identifier, context, dagChecker, pit);
        parameters.push_back(lastParam);
        return std::string();
      }
      std::string parameter;
      std::vector<cmGeneratorExpressionEvaluator*>::const_iterator it =
        pit->begin();
      const std::vector<cmGeneratorExpressionEvaluator*>::const_iterator end =
        pit->end();
      for (; it != end; ++it) {
        parameter += (*it)->Evaluate(context, dagChecker);
        if (context->HadError) {
          return std::string();
        }
      }
      parameters.push_back(parameter);
    }
  }

  if ((numExpected > cmGeneratorExpressionNode::DynamicParameters &&
       (unsigned int)numExpected != parameters.size())) {
    if (numExpected == 0) {
      reportError(context, this->GetOriginalExpression(),
                  "$<" + identifier + "> expression requires no parameters.");
    } else if (numExpected == 1) {
      reportError(context, this->GetOriginalExpression(), "$<" + identifier +
                    "> expression requires "
                    "exactly one parameter.");
    } else {
      std::ostringstream e;
      e << "$<" + identifier + "> expression requires " << numExpected
        << " comma separated parameters, but got " << parameters.size()
        << " instead.";
      reportError(context, this->GetOriginalExpression(), e.str());
    }
    return std::string();
  }

  if (numExpected == cmGeneratorExpressionNode::OneOrMoreParameters &&
      parameters.empty()) {
    reportError(context, this->GetOriginalExpression(), "$<" + identifier +
                  "> expression requires at least one parameter.");
  }
  if (numExpected == cmGeneratorExpressionNode::OneOrZeroParameters &&
      parameters.size() > 1) {
    reportError(context, this->GetOriginalExpression(), "$<" + identifier +
                  "> expression requires one or zero parameters.");
  }
  return std::string();
}